

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

int bcf_hdr_sync(bcf_hdr_t *h)

{
  int iVar1;
  uint *puVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  bcf_idpair_t *pbVar6;
  long lVar7;
  long lVar8;
  byte bVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  
  lVar12 = 0;
  do {
    puVar2 = (uint *)h->dict[lVar12];
    uVar5 = (ulong)*puVar2;
    if (uVar5 == 0) {
      uVar11 = 0xffffffff;
    }
    else {
      uVar11 = 0xffffffff;
      lVar7 = 0x28;
      bVar9 = 0;
      uVar10 = 0;
      do {
        if (((*(uint *)(*(long *)(puVar2 + 4) + (uVar10 >> 4 & 0xfffffff) * 4) >> (bVar9 & 0x1e) & 3
             ) == 0) && ((int)uVar11 <= (int)*(uint *)(*(long *)(puVar2 + 8) + lVar7))) {
          uVar11 = *(uint *)(*(long *)(puVar2 + 8) + lVar7);
        }
        uVar10 = uVar10 + 1;
        lVar7 = lVar7 + 0x30;
        bVar9 = bVar9 + 2;
      } while (uVar5 != uVar10);
    }
    if (h->n[lVar12] <= (int)uVar11) {
      pbVar6 = (bcf_idpair_t *)realloc(h->id[lVar12],(ulong)(uVar11 + 1) << 4);
      h->id[lVar12] = pbVar6;
      for (uVar4 = h->n[lVar12]; uVar4 <= uVar11; uVar4 = uVar4 + 1) {
        h->id[lVar12][uVar4].key = (char *)0x0;
        h->id[lVar12][uVar4].val = (bcf_idinfo_t *)0x0;
      }
      h->n[lVar12] = uVar11 + 1;
      uVar5 = (ulong)*puVar2;
    }
    if ((int)uVar5 != 0) {
      lVar7 = *(long *)(puVar2 + 4);
      lVar8 = 0x28;
      bVar9 = 0;
      uVar10 = 0;
      do {
        if ((*(uint *)(lVar7 + (uVar10 >> 4 & 0xfffffff) * 4) >> (bVar9 & 0x1e) & 3) == 0) {
          lVar3 = *(long *)(puVar2 + 8);
          iVar1 = *(int *)(lVar3 + lVar8);
          h->id[lVar12][iVar1].key = *(char **)(*(long *)(puVar2 + 6) + uVar10 * 8);
          h->id[lVar12][iVar1].val = (bcf_idinfo_t *)((int *)(lVar3 + lVar8) + -10);
        }
        uVar10 = uVar10 + 1;
        lVar8 = lVar8 + 0x30;
        bVar9 = bVar9 + 2;
      } while (uVar5 != uVar10);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  h->dirty = 0;
  return 0;
}

Assistant:

int bcf_hdr_sync(bcf_hdr_t *h)
{
    int i;
    for (i = 0; i < 3; i++)
    {
        vdict_t *d = (vdict_t*)h->dict[i];
        khint_t k;

        // find out the largest id, there may be holes because of IDX
        int max_id = -1;
        for (k=kh_begin(d); k<kh_end(d); k++)
        {
            if (!kh_exist(d,k)) continue;
            if ( max_id < kh_val(d,k).id ) max_id = kh_val(d,k).id;
        }
        if ( max_id >= h->n[i] )
        {
            h->id[i] = (bcf_idpair_t*)realloc(h->id[i], (max_id+1)*sizeof(bcf_idpair_t));
            for (k=h->n[i]; k<=max_id; k++)
            {
                h->id[i][k].key = NULL;
                h->id[i][k].val = NULL;
            }
            h->n[i] = max_id+1;
        }
        for (k=kh_begin(d); k<kh_end(d); k++)
        {
            if (!kh_exist(d,k)) continue;
            h->id[i][kh_val(d,k).id].key = kh_key(d,k);
            h->id[i][kh_val(d,k).id].val = &kh_val(d,k);
        }
    }
    h->dirty = 0;
    return 0;
}